

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_file.cpp
# Opt level: O0

bool ApiLayerManifestFile::LocateLibraryRelativeToJson
               (string *json_filename,string *library_path,string *out_combined_path)

{
  bool bVar1;
  undefined1 local_68 [8];
  string file_parent;
  string combined_path;
  string *out_combined_path_local;
  string *library_path_local;
  string *json_filename_local;
  
  std::__cxx11::string::string((string *)(file_parent.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_68);
  bVar1 = FileSysUtilsGetParentPath(json_filename,(string *)local_68);
  if (((bVar1) &&
      (bVar1 = FileSysUtilsCombinePaths
                         ((string *)local_68,library_path,(string *)((long)&file_parent.field_2 + 8)
                         ), bVar1)) &&
     (bVar1 = FileSysUtilsPathExists((string *)((long)&file_parent.field_2 + 8)), bVar1)) {
    std::__cxx11::string::operator=
              ((string *)out_combined_path,(string *)(file_parent.field_2._M_local_buf + 8));
    json_filename_local._7_1_ = true;
  }
  else {
    std::__cxx11::string::operator=
              ((string *)out_combined_path,(string *)(file_parent.field_2._M_local_buf + 8));
    json_filename_local._7_1_ = false;
  }
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(file_parent.field_2._M_local_buf + 8));
  return json_filename_local._7_1_;
}

Assistant:

bool ApiLayerManifestFile::LocateLibraryRelativeToJson(
    const std::string &json_filename, const std::string &library_path,
    std::string &out_combined_path) {  // Otherwise, treat the library path as a relative path based on the JSON file.
    std::string combined_path;
    std::string file_parent;
    if (!FileSysUtilsGetParentPath(json_filename, file_parent) ||
        !FileSysUtilsCombinePaths(file_parent, library_path, combined_path) || !FileSysUtilsPathExists(combined_path)) {
        out_combined_path = combined_path;
        return false;
    }
    out_combined_path = combined_path;
    return true;
}